

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O2

void __thiscall fc_layer_t::fc_layer_t(fc_layer_t *this,tdsize in_size,int out_size)

{
  int iVar1;
  float *pfVar2;
  uint _y;
  int h;
  uint _x;
  int _x_00;
  int _y_00;
  uint _x_01;
  tensor_t<float> local_a8;
  tensor_t<float> local_80;
  tensor_t<float> local_58;
  
  iVar1 = in_size.z;
  _y_00 = in_size.y;
  _x_00 = in_size.x;
  tensor_t<float>::tensor_t(&local_a8,_x_00,_y_00,iVar1);
  tensor_t<float>::tensor_t(&local_80,_x_00,_y_00,iVar1);
  tensor_t<float>::tensor_t(&local_58,out_size,1,1);
  layer_t::layer_t(&this->super_layer_t,fc,&local_a8,&local_80,&local_58);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_58);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_80);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_a8);
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _x_01 = iVar1 * _x_00 * _y_00;
  tensor_t<float>::tensor_t(&this->weights,_x_01,out_size,1);
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_a8.data,(long)out_size,(allocator_type *)&local_80);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&this->input,&local_a8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_a8);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::vector
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)&local_a8,(long)out_size,
             (allocator_type *)&local_80);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::_M_move_assign(&this->gradients,&local_a8);
  std::_Vector_base<gradient_t,_std::allocator<gradient_t>_>::~_Vector_base
            ((_Vector_base<gradient_t,_std::allocator<gradient_t>_> *)&local_a8);
  for (_y = 0; _y != (~(out_size >> 0x1f) & out_size); _y = _y + 1) {
    for (_x = 0; (~((int)_x_01 >> 0x1f) & _x_01) != _x; _x = _x + 1) {
      iVar1 = rand();
      pfVar2 = tensor_t<float>::get(&this->weights,_x,_y,0);
      *pfVar2 = (float)iVar1 * 1.0231603e-09 * (1.0 / (float)(int)_x_01);
    }
  }
  return;
}

Assistant:

fc_layer_t(tdsize in_size, int out_size) :
      layer_t(layer_type::fc,
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(out_size, 1, 1)), weights(in_size.x * in_size.y * in_size.z, out_size, 1) {
    input = std::vector<float>(static_cast<unsigned long>(out_size));
    gradients = std::vector<gradient_t>(static_cast<unsigned long>(out_size));

    int maxval = in_size.x * in_size.y * in_size.z;

    // weight initialization
    for (int i = 0; i < out_size; i++)
      for (int h = 0; h < in_size.x * in_size.y * in_size.z; h++)
        weights(h, i, 0) = 2.19722f / maxval * rand() / float(RAND_MAX);
    // 2.19722f = f^-1(0.9) => x where [1 / (1 + exp(-x) ) = 0.9]
  }